

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O0

bool stl_reader::
     ReadStlFile_BINARY<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  float fVar1;
  byte bVar2;
  index_t iVar3;
  float *pfVar4;
  size_type sVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  uint local_b8c [2];
  undefined1 local_b81;
  string local_b80 [32];
  stringstream local_b60 [8];
  stringstream ss_4;
  ostream local_b50 [378];
  undefined1 local_9d6 [2];
  uint local_9d4;
  uint uStack_9d0;
  char addData [2];
  uint local_9cc;
  ulong local_9c8;
  size_t i_1;
  CoordWithIndex<float,_unsigned_int> c;
  size_t ivrt;
  int i;
  stringstream local_980 [8];
  stringstream ss_3;
  ostream local_970 [376];
  float local_7f8 [2];
  float d [12];
  undefined1 local_7c0 [4];
  uint tri;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  string local_7a0 [32];
  stringstream local_780 [8];
  stringstream ss_2;
  ostream local_770 [376];
  float local_5f8;
  undefined1 local_5f1;
  uint numTris;
  stringstream local_5d0 [8];
  stringstream ss_1;
  ostream local_5c0 [376];
  undefined1 local_448 [8];
  char stl_header [80];
  string local_3f0 [32];
  stringstream local_3d0 [8];
  stringstream ss;
  ostream local_3c0 [392];
  long local_238;
  ifstream in;
  ArrayAnnex<unsigned_int> *solidRangesOut_local;
  ArrayAnnex<unsigned_int> *trisOut_local;
  ArrayAnnex<float> *normalsOut_local;
  ArrayAnnex<float> *coordsOut_local;
  char *filename_local;
  
  lume::ArrayAnnex<float>::clear(coordsOut);
  lume::ArrayAnnex<float>::clear(normalsOut);
  lume::ArrayAnnex<unsigned_int>::clear(trisOut);
  lume::ArrayAnnex<unsigned_int>::clear(solidRangesOut);
  std::ifstream::ifstream(&local_238,filename,_S_bin);
  bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar2 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_3d0);
    poVar6 = std::operator<<(local_3c0,"Couldnt open file ");
    std::operator<<(poVar6,filename);
    stl_header[0x4f] = '\x01';
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar7,local_3f0);
    stl_header[0x4f] = '\0';
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)&local_238,(long)local_448);
  bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar2 & 1) == 0) {
    local_5f8 = 0.0;
    std::istream::read((char *)&local_238,(long)&local_5f8);
    bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_780);
      poVar6 = std::operator<<(local_770,"Couldnt determine number of triangles in binary stl file "
                              );
      std::operator<<(poVar6,filename);
      coordsWithIndex.
      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar7,local_7a0);
      coordsWithIndex.
      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
    ::vector((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              *)local_7c0);
    d[0xb] = 0.0;
    while( true ) {
      if ((uint)local_5f8 <= (uint)d[0xb]) {
        local_b8c[1] = 0;
        lume::ArrayAnnex<unsigned_int>::push_back(solidRangesOut,local_b8c + 1);
        iVar3 = lume::ArrayAnnex<unsigned_int>::size(trisOut);
        local_b8c[0] = iVar3 / 3;
        lume::ArrayAnnex<unsigned_int>::push_back(solidRangesOut,local_b8c);
        stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
                  (coordsOut,trisOut,
                   (vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                    *)local_7c0);
        std::
        vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ::~vector((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                   *)local_7c0);
        std::ifstream::~ifstream(&local_238);
        return true;
      }
      std::istream::read((char *)&local_238,(long)local_7f8);
      bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
      if ((bVar2 & 1) != 0) break;
      for (ivrt._0_4_ = 0; (int)ivrt < 3; ivrt._0_4_ = (int)ivrt + 1) {
        lume::ArrayAnnex<float>::push_back(normalsOut,d + (long)(int)ivrt + -2);
      }
      c.data[2] = 1.4013e-45;
      c.index = 0;
      for (; (ulong)c._8_8_ < 4; c._8_8_ = c._8_8_ + 1) {
        for (local_9c8 = 0; local_9c8 < 3; local_9c8 = local_9c8 + 1) {
          fVar1 = d[c._8_8_ * 3 + local_9c8 + -2];
          pfVar4 = stl_reader_impl::CoordWithIndex<float,_unsigned_int>::operator[]
                             ((CoordWithIndex<float,_unsigned_int> *)&i_1,local_9c8);
          *pfVar4 = fVar1;
        }
        sVar5 = std::
                vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                        *)local_7c0);
        c.data[1] = (float)sVar5;
        std::
        vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
        ::push_back((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                     *)local_7c0,(value_type *)&i_1);
      }
      sVar5 = std::
              vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      *)local_7c0);
      local_9cc = (int)sVar5 - 3;
      lume::ArrayAnnex<unsigned_int>::push_back(trisOut,&local_9cc);
      sVar5 = std::
              vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      *)local_7c0);
      uStack_9d0 = (int)sVar5 - 2;
      lume::ArrayAnnex<unsigned_int>::push_back(trisOut,&stack0xfffffffffffff630);
      sVar5 = std::
              vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ::size((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                      *)local_7c0);
      local_9d4 = (int)sVar5 - 1;
      lume::ArrayAnnex<unsigned_int>::push_back(trisOut,&local_9d4);
      std::istream::read((char *)&local_238,(long)local_9d6);
      bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
      if ((bVar2 & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_b60);
        poVar6 = std::operator<<(local_b50,
                                 "Error while parsing additional triangle data in binary stl file ")
        ;
        std::operator<<(poVar6,filename);
        local_b81 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar7,local_b80);
        local_b81 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      d[0xb] = (float)((int)d[0xb] + 1);
    }
    std::__cxx11::stringstream::stringstream(local_980);
    poVar6 = std::operator<<(local_970,"Error while parsing trianlge in binary stl file ");
    std::operator<<(poVar6,filename);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar7,(string *)&i);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_5d0);
  poVar6 = std::operator<<(local_5c0,"Error while parsing binary stl header in file ");
  std::operator<<(poVar6,filename);
  local_5f1 = 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar7,(string *)&numTris);
  local_5f1 = 0;
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadStlFile_BINARY(const char* filename,
                        TNumberContainer1& coordsOut,
                        TNumberContainer2& normalsOut,
                        TIndexContainer1& trisOut,
					    TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename, ios::binary);
	STL_READER_COND_THROW(!in, "Couldnt open file " << filename);

	char stl_header[80];
	in.read(stl_header, 80);
	STL_READER_COND_THROW(!in, "Error while parsing binary stl header in file " << filename);

	unsigned int numTris = 0;
	in.read((char*)&numTris, 4);
	STL_READER_COND_THROW(!in, "Couldnt determine number of triangles in binary stl file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	for(unsigned int tri = 0; tri < numTris; ++tri){
		float d[12];
		in.read((char*)d, 12 * 4);
		STL_READER_COND_THROW(!in, "Error while parsing trianlge in binary stl file " << filename);

		for(int i = 0; i < 3; ++i)
			normalsOut.push_back (d[i]);

		for(size_t ivrt = 1; ivrt < 4; ++ivrt){
			CoordWithIndex <number_t, index_t> c;
			for(size_t i = 0; i < 3; ++i)
				c[i] = d[ivrt * 3 + i];
			c.index = static_cast<index_t>(coordsWithIndex.size());
			coordsWithIndex.push_back(c);
		}

		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
		trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));

		char addData[2];
		in.read(addData, 2);
		STL_READER_COND_THROW(!in, "Error while parsing additional triangle data in binary stl file " << filename);
	}

	solidRangesOut.push_back(0);
	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}